

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# util.cc
# Opt level: O0

string * ElideMiddle(string *__return_storage_ptr__,string *str,size_t width)

{
  ulong uVar1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_c8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_a8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_88;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_68;
  ulong local_48;
  size_t elide_size;
  allocator<char> local_37;
  allocator<char> local_36;
  allocator<char> local_35;
  int kMargin;
  allocator<char> local_21;
  size_t local_20;
  size_t width_local;
  string *str_local;
  string *result;
  
  local_20 = width;
  width_local = (size_t)str;
  str_local = __return_storage_ptr__;
  switch(width) {
  case 0:
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)__return_storage_ptr__,"",&local_21);
    std::allocator<char>::~allocator(&local_21);
    break;
  case 1:
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)__return_storage_ptr__,".",&local_35);
    std::allocator<char>::~allocator(&local_35);
    break;
  case 2:
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)__return_storage_ptr__,"..",&local_36);
    std::allocator<char>::~allocator(&local_36);
    break;
  case 3:
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)__return_storage_ptr__,"...",&local_37);
    std::allocator<char>::~allocator(&local_37);
    break;
  default:
    elide_size._4_4_ = 3;
    elide_size._3_1_ = 0;
    std::__cxx11::string::string((string *)__return_storage_ptr__,(string *)str);
    uVar1 = std::__cxx11::string::size();
    if (local_20 < uVar1) {
      local_48 = local_20 - 3 >> 1;
      std::__cxx11::string::substr((ulong)&local_a8,(ulong)__return_storage_ptr__);
      std::operator+(&local_88,&local_a8,"...");
      std::__cxx11::string::size();
      std::__cxx11::string::substr((ulong)&local_c8,(ulong)__return_storage_ptr__);
      std::operator+(&local_68,&local_88,&local_c8);
      std::__cxx11::string::operator=((string *)__return_storage_ptr__,(string *)&local_68);
      std::__cxx11::string::~string((string *)&local_68);
      std::__cxx11::string::~string((string *)&local_c8);
      std::__cxx11::string::~string((string *)&local_88);
      std::__cxx11::string::~string((string *)&local_a8);
    }
  }
  return __return_storage_ptr__;
}

Assistant:

string ElideMiddle(const string& str, size_t width) {
  switch (width) {
      case 0: return "";
      case 1: return ".";
      case 2: return "..";
      case 3: return "...";
  }
  const int kMargin = 3;  // Space for "...".
  string result = str;
  if (result.size() > width) {
    size_t elide_size = (width - kMargin) / 2;
    result = result.substr(0, elide_size)
      + "..."
      + result.substr(result.size() - elide_size, elide_size);
  }
  return result;
}